

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O1

ElementsAddRawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::AddRawTransaction
          (ElementsAddRawTransactionResponseStruct *__return_storage_ptr__,
          ElementsAddRawTransactionRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  _Any_data local_148;
  undefined1 local_138 [32];
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  uint32_t local_f0;
  pointer local_e8 [2];
  undefined1 local_d8 [32];
  char local_b8 [16];
  undefined1 auStack_a8 [8];
  undefined1 local_a0 [32];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->btc_addresses).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->btc_addresses).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->btc_addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->btc_addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = 0;
  local_158._8_8_ =
       std::
       _Function_handler<cfd::js::api::ElementsAddRawTransactionResponseStruct_(const_cfd::js::api::ElementsAddRawTransactionRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:213:20)>
       ::_M_invoke;
  local_158._0_8_ =
       std::
       _Function_handler<cfd::js::api::ElementsAddRawTransactionResponseStruct_(const_cfd::js::api::ElementsAddRawTransactionRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:213:20)>
       ::_M_manager;
  local_148._M_unused._M_object = (pointer)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"AddRawTransaction","");
  ExecuteStructApi<cfd::js::api::ElementsAddRawTransactionRequestStruct,cfd::js::api::ElementsAddRawTransactionResponseStruct>
            ((ElementsAddRawTransactionResponseStruct *)(local_138 + 0x10),(api *)request,
             (ElementsAddRawTransactionRequestStruct *)local_168,
             (function<cfd::js::api::ElementsAddRawTransactionResponseStruct_(const_cfd::js::api::ElementsAddRawTransactionRequestStruct_&)>
              *)&local_148,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_138 + 0x10));
  local_50._8_8_ =
       (__return_storage_ptr__->btc_addresses).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_40._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->btc_addresses).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_40._8_8_ =
       (__return_storage_ptr__->btc_addresses).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->btc_addresses).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._16_8_;
  (__return_storage_ptr__->btc_addresses).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_100._M_allocated_capacity;
  (__return_storage_ptr__->btc_addresses).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_100._8_8_;
  local_118._16_8_ = (pointer)0x0;
  local_100._M_allocated_capacity = 0;
  local_100._8_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_50 + 8));
  (__return_storage_ptr__->error).code = local_f0;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)local_e8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)(local_d8 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if ((_Base_ptr)local_a0._8_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_a0._0_4_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)local_a0._8_8_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)local_a0._16_8_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)local_a0._24_8_;
    *(_Rb_tree_header **)(local_a0._8_8_ + 8) =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_80._0_8_;
    local_a0._8_8_ = (_Base_ptr)0x0;
    local_80._0_8_ = 0;
    local_a0._16_8_ = (_Base_ptr)(auStack_a8 + 8);
    local_a0._24_8_ = (_Base_ptr)(auStack_a8 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if ((_Base_ptr)local_70._8_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_70._M_allocated_capacity._0_4_;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_70._8_8_;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_60._M_allocated_capacity;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_60._8_8_;
    *(_Rb_tree_header **)(local_70._8_8_ + 8) =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_50._0_8_;
    local_70._8_8_ = (_Base_ptr)0x0;
    local_50._0_8_ = (_Base_ptr)0x0;
    local_60._M_allocated_capacity = (size_type)&local_70;
    local_60._8_8_ = &local_70;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_80 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_a8);
  if ((char *)local_d8._16_8_ != local_b8) {
    operator_delete((void *)local_d8._16_8_);
  }
  if (local_e8[0] != (pointer)local_d8) {
    operator_delete(local_e8[0]);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_118 + 0x10));
  if ((pointer)local_138._16_8_ != (pointer)local_118) {
    operator_delete((void *)local_138._16_8_);
  }
  if ((pointer)local_148._M_unused._0_8_ != (pointer)local_138) {
    operator_delete(local_148._M_unused._M_object);
  }
  if ((code *)local_158._0_8_ != (code *)0x0) {
    (*(code *)local_158._0_8_)(local_168,local_168,3);
  }
  return __return_storage_ptr__;
}

Assistant:

ElementsAddRawTransactionResponseStruct
ElementsTransactionStructApi::AddRawTransaction(  // NOLINT
    const ElementsAddRawTransactionRequestStruct& request) {
  auto call_func = [](const ElementsAddRawTransactionRequestStruct& request)
      -> ElementsAddRawTransactionResponseStruct {  // NOLINT
    ElementsAddRawTransactionResponseStruct response;
    ElementsAddressFactory address_factory;
    // Transaction作成
    std::vector<ConfidentialTxIn> txins;
    std::vector<ConfidentialTxOut> txouts;
    std::vector<TxInPeginParameters> pegins;
    std::vector<TxOutPegoutParameters> pegouts;

    // TxInの追加
    for (const auto& txin_req : request.txins) {
      txins.emplace_back(
          Txid(txin_req.txid), txin_req.vout, txin_req.sequence);
    }

    // add PeginWitness
    for (const auto& txin_req : request.pegin_txins) {
      Txid txid(txin_req.txid);
      txins.emplace_back(txid, txin_req.vout, txin_req.sequence);

      info(
          CFD_LOG_SOURCE, "rm btcWitness[{}]",
          txin_req.is_remove_mainchain_tx_witness);
      TxInPeginParameters pegin_data;
      pegin_data.txid = txid;
      pegin_data.vout = txin_req.vout;
      pegin_data.amount =
          Amount::CreateBySatoshiAmount(txin_req.peginwitness.amount);
      pegin_data.asset = ConfidentialAssetId(txin_req.peginwitness.asset);
      pegin_data.mainchain_blockhash =
          BlockHash(txin_req.peginwitness.mainchain_genesis_block_hash);
      pegin_data.claim_script = Script(txin_req.peginwitness.claim_script);
      pegin_data.mainchain_raw_tx =
          ConfidentialTransaction::GetBitcoinTransaction(
              ByteData(txin_req.peginwitness.mainchain_raw_transaction),
              txin_req.is_remove_mainchain_tx_witness);
      pegin_data.mainchain_txoutproof =
          ByteData(txin_req.peginwitness.mainchain_txoutproof);
      pegins.push_back(pegin_data);
    }

    // TxOutの追加
    Script script;
    for (const auto& txout_req : request.txouts) {
      const std::string& addr = txout_req.address;
      Amount amount(Amount::CreateBySatoshiAmount(txout_req.amount));
      ConfidentialAssetId asset(txout_req.asset);
      if (!txout_req.direct_locking_script.empty()) {
        txouts.emplace_back(
            Script(txout_req.direct_locking_script), asset,
            ConfidentialValue(amount),
            ConfidentialNonce(txout_req.direct_nonce), ByteData(), ByteData());
      } else {
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          if (txout_req.is_remove_nonce) {
            txouts.emplace_back(
                confidential_addr.GetUnblindedAddress(), asset, amount);
          } else {
            txouts.emplace_back(confidential_addr, asset, amount);
          }
        } else {
          ConfidentialTxOut txout(
              address_factory.GetAddress(addr), asset, amount);
          txout.SetNonce(ConfidentialNonce(txout_req.direct_nonce));
          txouts.emplace_back(txout);
        }
      }
    }

    for (const auto& destroy_req : request.destroy_amount_txouts) {
      // DestroyのTxOut追加
      ConfidentialTxOut destroy_txout =
          ConfidentialTxOut::CreateDestroyAmountTxOut(
              ConfidentialAssetId(destroy_req.asset),
              Amount::CreateBySatoshiAmount(destroy_req.amount));
      destroy_txout.SetNonce(ConfidentialNonce(destroy_req.direct_nonce));
      txouts.push_back(destroy_txout);
    }

    for (const auto& pegout_req : request.pegout_txouts) {
      // PegoutのTxOut追加
      TxOutPegoutParameters pegout_data;
      pegout_data.amount = Amount::CreateBySatoshiAmount(pegout_req.amount);
      pegout_data.asset = ConfidentialAssetId(pegout_req.asset);
      pegout_data.genesisblock_hash =
          BlockHash(pegout_req.mainchain_genesis_block_hash);
      if (!pegout_req.btc_address.empty()) {
        pegout_data.btc_address = Address(pegout_req.btc_address);
      }
      pegout_data.net_type =
          AddressStructApi::ConvertNetType(pegout_req.network);
      std::string elements_nettype = pegout_req.elements_network;
      if (elements_nettype.empty()) {
        if (pegout_data.net_type == NetType::kMainnet) {
          elements_nettype = "liquidv1";
        } else {
          elements_nettype = "regtest";
        }
      }
      pegout_data.elements_net_type =
          ElementsAddressStructApi::ConvertElementsNetType(elements_nettype);
      if (!pegout_req.online_pubkey.empty() &&
          !pegout_req.master_online_key.empty()) {
        if (pegout_req.master_online_key.size() == Privkey::kPrivkeySize * 2) {
          // hex
          pegout_data.master_online_key =
              Privkey(pegout_req.master_online_key);
        } else {
          // Wif
          pegout_data.master_online_key = Privkey::FromWif(
              pegout_req.master_online_key, pegout_data.net_type);
        }
        pegout_data.online_pubkey = Pubkey(pegout_req.online_pubkey);
        pegout_data.bitcoin_descriptor = pegout_req.bitcoin_descriptor;
        pegout_data.bip32_counter = pegout_req.bip32_counter;
        pegout_data.whitelist = ByteData(pegout_req.whitelist);
      }
      pegouts.push_back(pegout_data);
    }

    // feeの追加
    ConfidentialTxOut txout_fee;
    auto& fee_req = request.fee;
    // amountが0のfeeは無効と判定
    if (fee_req.amount != 0) {
      txout_fee = ConfidentialTxOut(
          ConfidentialAssetId(fee_req.asset),
          Amount::CreateBySatoshiAmount(fee_req.amount));
    }

    std::map<std::string, Amount> pegout_addresses;
    ElementsTransactionApi api;
    ConfidentialTransactionController ctxc = api.AddRawTransaction(
        request.tx, txins, pegins, txouts, pegouts, txout_fee,
        &pegout_addresses);

    // すべて設定後にTxoutのRandomSort
    if (request.is_random_sort_tx_out) {
      ctxc.RandomSortTxOut();
    }

    for (const auto& item : pegout_addresses) {
      if (!item.first.empty()) {
        response.btc_addresses.push_back(item.first);
      }
    }
    response.hex = ctxc.GetHex();
    return response;
  };

  ElementsAddRawTransactionResponseStruct result;
  result = ExecuteStructApi<
      ElementsAddRawTransactionRequestStruct,
      ElementsAddRawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}